

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allmain.c
# Opt level: O0

int command_input(int cmdidx,int rep,nh_cmd_arg *arg)

{
  boolean didmove_00;
  int iVar1;
  boolean didmove;
  nh_cmd_arg *arg_local;
  int rep_local;
  int cmdidx_local;
  
  if ((multi < 0) || (occupation == (_func_int *)0x0)) {
    if ((multi == 0) || ((0 < multi && (cmdidx != -1)))) {
      saved_cmd = cmdidx;
      do_command(cmdidx,rep,'\x01',arg);
    }
    else if (0 < multi) {
      if (rep == -1) {
        nomul(0,(char *)0x0);
        return 0;
      }
      if (flags.mv == '\0') {
        do_command(saved_cmd,multi,'\0',arg);
      }
      else {
        if ((multi < 0x50) && (multi = multi + -1, multi == 0)) {
          flags.run = 0;
          flags.mv = '\0';
          iflags.travel1 = '\0';
          flags.travel = '\0';
        }
        iVar1 = domove(u.dx,u.dy,'\0');
        if (iVar1 == 0) {
          flags.move = '\0';
          nomul(0,(char *)0x0);
        }
      }
    }
  }
  else {
    handle_occupation();
  }
  if (u.utotype == '\0') {
    if ((flags.move == '\0') || (flags.mv == '\0')) {
      iflags.botl = '\x01';
    }
  }
  else {
    deferred_goto();
  }
  if (vision_full_recalc != '\0') {
    vision_recalc(0);
  }
  if (((flags.run == 0) || (iflags.runmode == 0)) && (multi != 0)) {
    if (flags.travel == '\0') {
      if (multi % 7 != 0) goto LAB_0014499d;
    }
    else if ((ulong)moves % 7 != 0) goto LAB_0014499d;
    if (flags.run != 0) {
      iflags.botl = '\x01';
    }
    flush_screen();
  }
LAB_0014499d:
  didmove_00 = flags.move;
  if (flags.move != '\0') {
    you_moved();
  }
  xmalloc_cleanup();
  iflags.next_msg_nonblocking = '\0';
  flags.move = '\x01';
  pre_move_tasks(didmove_00);
  do_delay_msg();
  if ((multi == 0) && (occupation == (_func_int *)0x0)) {
    flush_screen();
    maybe_tutorial();
  }
  return -1;
}

Assistant:

int command_input(int cmdidx, int rep, struct nh_cmd_arg *arg)
{
    boolean didmove = FALSE;
    
    if (multi >= 0 && occupation)
	handle_occupation();
    else if (multi == 0 || (multi > 0 && cmdidx != -1)) {
	saved_cmd = cmdidx;
	do_command(cmdidx, rep, TRUE, arg);
    } else if (multi > 0) {
	/* allow interruption of multi-turn commands */
	if (rep == -1) {
	    nomul(0, NULL);
	    return READY_FOR_INPUT;
	}
	
	if (flags.mv) {
	    if (multi < COLNO && !--multi)
		flags.travel = iflags.travel1 = flags.mv = flags.run = 0;
	    if (!domove(u.dx, u.dy, 0)) {
		/* Don't use a move when travelling into an obstacle. */
		flags.move = FALSE;
		nomul(0, NULL);
	    }
	} else
	    do_command(saved_cmd, multi, FALSE, arg);
    }
    /* no need to do anything here for multi < 0 */
    
    if (u.utotype)		/* change dungeon level */
	deferred_goto();	/* after rhack() */
    /* !flags.move here: multiple movement command stopped */
    else if (!flags.move || !flags.mv)
	iflags.botl = 1;

    if (vision_full_recalc)
	vision_recalc(0);	/* vision! */
    /* when running in non-tport mode, this gets done through domove() */
    if ((!flags.run || iflags.runmode == RUN_TPORT) &&
	    (multi && (!flags.travel ? !(multi % 7) : !(moves % 7L)))) {
	if (flags.run)
	    iflags.botl = 1;
	flush_screen();
    }
    
    didmove = flags.move;
    if (didmove) {
	you_moved();
    } /* actual time passed */

    /****************************************/
    /* once-per-player-input things go here */
    /****************************************/
    xmalloc_cleanup();
    iflags.next_msg_nonblocking = FALSE;

    /* prepare for the next move */
    flags.move = 1;
    pre_move_tasks(didmove);
    do_delay_msg();
    if (multi == 0 && !occupation) {
	flush_screen(); /* Flush screen buffer */
	maybe_tutorial();
    }
    
    return -1;
}